

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_slice_header(bitstream *str,h264_seqparm **seqparms,h264_picparm **picparms,
                     h264_slice *slice)

{
  uint32_t uVar1;
  h264_seqparm **str_00;
  int iVar2;
  uint32_t *val;
  byte local_3d;
  uint32_t local_3c;
  uint32_t local_38;
  uint local_34;
  uint32_t pic_parameter_set_id;
  uint32_t slice_type;
  h264_slice *slice_local;
  h264_picparm **picparms_local;
  h264_seqparm **seqparms_local;
  bitstream *str_local;
  
  _pic_parameter_set_id = slice;
  slice_local = (h264_slice *)picparms;
  picparms_local = (h264_picparm **)seqparms;
  seqparms_local = (h264_seqparm **)str;
  iVar2 = vs_ue(str,&slice->first_mb_in_slice);
  if (iVar2 == 0) {
    local_34 = _pic_parameter_set_id->slice_type + _pic_parameter_set_id->slice_all_same * 5;
    iVar2 = vs_ue((bitstream *)seqparms_local,&local_34);
    if (iVar2 == 0) {
      _pic_parameter_set_id->slice_type = local_34 % 5;
      _pic_parameter_set_id->slice_all_same = local_34 / 5;
      if (*(int *)seqparms_local == 0) {
        local_38 = _pic_parameter_set_id->picparm->pic_parameter_set_id;
      }
      iVar2 = vs_ue((bitstream *)seqparms_local,&local_38);
      if (iVar2 == 0) {
        if (*(int *)seqparms_local == 1) {
          if (0xff < local_38) {
            fprintf(_stderr,"pic_parameter_set_id out of range\n");
            return 1;
          }
          _pic_parameter_set_id->picparm =
               *(h264_picparm **)(slice_local->delta_pic_order_cnt + (ulong)local_38 * 2 + -0x19);
          if (_pic_parameter_set_id->picparm == (h264_picparm *)0x0) {
            fprintf(_stderr,"pic_parameter_set_id doesn\'t specify a picparm\n");
            return 1;
          }
          _pic_parameter_set_id->seqparm =
               (h264_seqparm *)picparms_local[_pic_parameter_set_id->picparm->seq_parameter_set_id];
          if (_pic_parameter_set_id->seqparm == (h264_seqparm *)0x0) {
            fprintf(_stderr,"seq_parameter_set_id doesn\'t specify a seqparm\n");
            return 1;
          }
          if (_pic_parameter_set_id->nal_unit_type == 0x13) {
            _pic_parameter_set_id->chroma_array_type = 0;
            _pic_parameter_set_id->bit_depth_luma_minus8 =
                 _pic_parameter_set_id->seqparm->bit_depth_aux_minus8;
            _pic_parameter_set_id->bit_depth_chroma_minus8 = 0;
          }
          else {
            if (_pic_parameter_set_id->seqparm->separate_colour_plane_flag == 0) {
              local_3c = _pic_parameter_set_id->seqparm->chroma_format_idc;
            }
            else {
              local_3c = 0;
            }
            _pic_parameter_set_id->chroma_array_type = local_3c;
            _pic_parameter_set_id->bit_depth_luma_minus8 =
                 _pic_parameter_set_id->seqparm->bit_depth_luma_minus8;
            _pic_parameter_set_id->bit_depth_chroma_minus8 =
                 _pic_parameter_set_id->seqparm->bit_depth_chroma_minus8;
          }
          _pic_parameter_set_id->pic_width_in_mbs =
               _pic_parameter_set_id->seqparm->pic_width_in_mbs_minus1 + 1;
        }
        if ((_pic_parameter_set_id->seqparm->separate_colour_plane_flag == 0) ||
           (iVar2 = vs_u((bitstream *)seqparms_local,&_pic_parameter_set_id->colour_plane_id,2),
           iVar2 == 0)) {
          iVar2 = vs_u((bitstream *)seqparms_local,&_pic_parameter_set_id->frame_num,
                       _pic_parameter_set_id->seqparm->log2_max_frame_num_minus4 + 4);
          if (iVar2 == 0) {
            if (_pic_parameter_set_id->seqparm->frame_mbs_only_flag == 0) {
              iVar2 = vs_u((bitstream *)seqparms_local,&_pic_parameter_set_id->field_pic_flag,1);
              if (iVar2 != 0) {
                return 1;
              }
            }
            else {
              iVar2 = vs_infer((bitstream *)seqparms_local,&_pic_parameter_set_id->field_pic_flag,0)
              ;
              if (iVar2 != 0) {
                return 1;
              }
            }
            if (_pic_parameter_set_id->field_pic_flag == 0) {
              iVar2 = vs_infer((bitstream *)seqparms_local,&_pic_parameter_set_id->bottom_field_flag
                               ,0);
              if (iVar2 != 0) {
                return 1;
              }
            }
            else {
              iVar2 = vs_u((bitstream *)seqparms_local,&_pic_parameter_set_id->bottom_field_flag,1);
              if (iVar2 != 0) {
                return 1;
              }
            }
            _pic_parameter_set_id->pic_height_in_mbs =
                 _pic_parameter_set_id->seqparm->pic_height_in_map_units_minus1 + 1;
            if (_pic_parameter_set_id->seqparm->frame_mbs_only_flag == 0) {
              _pic_parameter_set_id->pic_height_in_mbs =
                   _pic_parameter_set_id->pic_height_in_mbs << 1;
            }
            if (_pic_parameter_set_id->field_pic_flag != 0) {
              _pic_parameter_set_id->pic_height_in_mbs =
                   _pic_parameter_set_id->pic_height_in_mbs >> 1;
            }
            _pic_parameter_set_id->pic_size_in_mbs =
                 _pic_parameter_set_id->pic_width_in_mbs * _pic_parameter_set_id->pic_height_in_mbs;
            if (*(int *)seqparms_local == 1) {
              local_3d = 0;
              if (_pic_parameter_set_id->seqparm->mb_adaptive_frame_field_flag != 0) {
                local_3d = _pic_parameter_set_id->field_pic_flag != 0 ^ 0xff;
              }
              _pic_parameter_set_id->mbaff_frame_flag = (uint)(local_3d & 1);
            }
            if ((_pic_parameter_set_id->idr_pic_flag == 0) ||
               (iVar2 = vs_ue((bitstream *)seqparms_local,&_pic_parameter_set_id->idr_pic_id),
               iVar2 == 0)) {
              uVar1 = _pic_parameter_set_id->seqparm->pic_order_cnt_type;
              if (uVar1 == 0) {
                iVar2 = vs_u((bitstream *)seqparms_local,&_pic_parameter_set_id->pic_order_cnt_lsb,
                             _pic_parameter_set_id->seqparm->log2_max_pic_order_cnt_lsb_minus4 + 4);
                if (iVar2 != 0) {
                  return 1;
                }
                if ((_pic_parameter_set_id->picparm->bottom_field_pic_order_in_frame_present_flag ==
                     0) || (_pic_parameter_set_id->field_pic_flag != 0)) {
                  iVar2 = vs_infers((bitstream *)seqparms_local,
                                    &_pic_parameter_set_id->delta_pic_order_cnt_bottom,0);
                  if (iVar2 != 0) {
                    return 1;
                  }
                }
                else {
                  iVar2 = vs_se((bitstream *)seqparms_local,
                                &_pic_parameter_set_id->delta_pic_order_cnt_bottom);
                  if (iVar2 != 0) {
                    return 1;
                  }
                }
              }
              else if (uVar1 == 1) {
                if (_pic_parameter_set_id->seqparm->delta_pic_order_always_zero_flag == 0) {
                  iVar2 = vs_se((bitstream *)seqparms_local,
                                _pic_parameter_set_id->delta_pic_order_cnt);
                  if (iVar2 != 0) {
                    return 1;
                  }
                  if ((_pic_parameter_set_id->picparm->bottom_field_pic_order_in_frame_present_flag
                       == 0) || (_pic_parameter_set_id->field_pic_flag != 0)) {
                    iVar2 = vs_infers((bitstream *)seqparms_local,
                                      _pic_parameter_set_id->delta_pic_order_cnt + 1,0);
                    if (iVar2 != 0) {
                      return 1;
                    }
                  }
                  else {
                    iVar2 = vs_se((bitstream *)seqparms_local,
                                  _pic_parameter_set_id->delta_pic_order_cnt + 1);
                    if (iVar2 != 0) {
                      return 1;
                    }
                  }
                }
                else {
                  iVar2 = vs_infers((bitstream *)seqparms_local,
                                    _pic_parameter_set_id->delta_pic_order_cnt,0);
                  if (iVar2 != 0) {
                    return 1;
                  }
                  iVar2 = vs_infers((bitstream *)seqparms_local,
                                    _pic_parameter_set_id->delta_pic_order_cnt + 1,0);
                  if (iVar2 != 0) {
                    return 1;
                  }
                }
              }
              if (_pic_parameter_set_id->picparm->redundant_pic_cnt_present_flag == 0) {
                iVar2 = vs_infer((bitstream *)seqparms_local,
                                 &_pic_parameter_set_id->redundant_pic_cnt,0);
                if (iVar2 != 0) {
                  return 1;
                }
              }
              else {
                iVar2 = vs_ue((bitstream *)seqparms_local,&_pic_parameter_set_id->redundant_pic_cnt)
                ;
                if (iVar2 != 0) {
                  return 1;
                }
              }
              if ((_pic_parameter_set_id->seqparm->is_svc == 0) ||
                 ((_pic_parameter_set_id->svc).quality_id == 0)) {
                if ((_pic_parameter_set_id->slice_type == 1) &&
                   (iVar2 = vs_u((bitstream *)seqparms_local,
                                 &_pic_parameter_set_id->direct_spatial_mb_pred_flag,1), iVar2 != 0)
                   ) {
                  return 1;
                }
                if ((_pic_parameter_set_id->slice_type != 2) &&
                   (_pic_parameter_set_id->slice_type != 4)) {
                  iVar2 = vs_u((bitstream *)seqparms_local,
                               &_pic_parameter_set_id->num_ref_idx_active_override_flag,1);
                  if (iVar2 != 0) {
                    return 1;
                  }
                  if (_pic_parameter_set_id->num_ref_idx_active_override_flag == 0) {
                    iVar2 = vs_infer((bitstream *)seqparms_local,
                                     &_pic_parameter_set_id->num_ref_idx_l0_active_minus1,
                                     _pic_parameter_set_id->picparm->
                                     num_ref_idx_l0_default_active_minus1);
                    if (iVar2 != 0) {
                      return 1;
                    }
                    if ((_pic_parameter_set_id->slice_type == 1) &&
                       (iVar2 = vs_infer((bitstream *)seqparms_local,
                                         &_pic_parameter_set_id->num_ref_idx_l1_active_minus1,
                                         _pic_parameter_set_id->picparm->
                                         num_ref_idx_l1_default_active_minus1), iVar2 != 0)) {
                      return 1;
                    }
                  }
                  else {
                    iVar2 = vs_ue((bitstream *)seqparms_local,
                                  &_pic_parameter_set_id->num_ref_idx_l0_active_minus1);
                    if (iVar2 != 0) {
                      return 1;
                    }
                    if ((_pic_parameter_set_id->slice_type == 1) &&
                       (iVar2 = vs_ue((bitstream *)seqparms_local,
                                      &_pic_parameter_set_id->num_ref_idx_l1_active_minus1),
                       iVar2 != 0)) {
                      return 1;
                    }
                  }
                  if (0x1f < _pic_parameter_set_id->num_ref_idx_l0_active_minus1) {
                    fprintf(_stderr,"num_ref_idx_l0_active_minus1 out of range\n");
                    return 1;
                  }
                  if (0x1f < _pic_parameter_set_id->num_ref_idx_l1_active_minus1) {
                    fprintf(_stderr,"num_ref_idx_l1_active_minus1 out of range\n");
                    return 1;
                  }
                  iVar2 = h264_ref_pic_list_modification
                                    ((bitstream *)seqparms_local,_pic_parameter_set_id,
                                     &_pic_parameter_set_id->ref_pic_list_modification_l0);
                  if (iVar2 != 0) {
                    return 1;
                  }
                  if ((_pic_parameter_set_id->slice_type == 1) &&
                     (iVar2 = h264_ref_pic_list_modification
                                        ((bitstream *)seqparms_local,_pic_parameter_set_id,
                                         &_pic_parameter_set_id->ref_pic_list_modification_l1),
                     iVar2 != 0)) {
                    return 1;
                  }
                }
                if (((_pic_parameter_set_id->picparm->weighted_pred_flag != 0) &&
                    ((_pic_parameter_set_id->slice_type == 0 ||
                     (_pic_parameter_set_id->slice_type == 3)))) ||
                   ((_pic_parameter_set_id->picparm->weighted_bipred_idc == 1 &&
                    (_pic_parameter_set_id->slice_type == 1)))) {
                  if ((_pic_parameter_set_id->seqparm->is_svc == 0) ||
                     ((_pic_parameter_set_id->svc).no_inter_layer_pred_flag != 0)) {
                    iVar2 = vs_infer((bitstream *)seqparms_local,
                                     &_pic_parameter_set_id->base_pred_weight_table_flag,0);
                    if (iVar2 != 0) {
                      return 1;
                    }
                  }
                  else {
                    iVar2 = vs_u((bitstream *)seqparms_local,
                                 &_pic_parameter_set_id->base_pred_weight_table_flag,1);
                    if (iVar2 != 0) {
                      return 1;
                    }
                  }
                  if ((_pic_parameter_set_id->base_pred_weight_table_flag == 0) &&
                     (iVar2 = h264_pred_weight_table
                                        ((bitstream *)seqparms_local,_pic_parameter_set_id,
                                         &_pic_parameter_set_id->pred_weight_table), iVar2 != 0)) {
                    return 1;
                  }
                }
                if (_pic_parameter_set_id->nal_ref_idc != 0) {
                  iVar2 = h264_dec_ref_pic_marking
                                    ((bitstream *)seqparms_local,_pic_parameter_set_id->idr_pic_flag
                                     ,&_pic_parameter_set_id->dec_ref_pic_marking);
                  if (iVar2 != 0) {
                    return 1;
                  }
                  if (((_pic_parameter_set_id->seqparm->is_svc != 0) &&
                      (_pic_parameter_set_id->seqparm->slice_header_restriction_flag == 0)) &&
                     (iVar2 = h264_dec_ref_base_pic_marking
                                        ((bitstream *)seqparms_local,&_pic_parameter_set_id->svc,
                                         &_pic_parameter_set_id->dec_ref_base_pic_marking),
                     iVar2 != 0)) {
                    return 1;
                  }
                }
              }
              if (((_pic_parameter_set_id->picparm->entropy_coding_mode_flag != 0) &&
                  (_pic_parameter_set_id->slice_type != 2)) &&
                 (_pic_parameter_set_id->slice_type != 4)) {
                iVar2 = vs_ue((bitstream *)seqparms_local,&_pic_parameter_set_id->cabac_init_idc);
                if (iVar2 != 0) {
                  return 1;
                }
                if (2 < _pic_parameter_set_id->cabac_init_idc) {
                  fprintf(_stderr,"cabac_init_idc out of range!\n");
                  return 1;
                }
              }
              iVar2 = vs_se((bitstream *)seqparms_local,&_pic_parameter_set_id->slice_qp_delta);
              if (iVar2 == 0) {
                _pic_parameter_set_id->sliceqpy =
                     _pic_parameter_set_id->picparm->pic_init_qp_minus26 + 0x1a +
                     _pic_parameter_set_id->slice_qp_delta;
                if ((_pic_parameter_set_id->slice_type == 3) &&
                   (iVar2 = vs_u((bitstream *)seqparms_local,
                                 &_pic_parameter_set_id->sp_for_switch_flag,1), iVar2 != 0)) {
                  str_local._4_4_ = 1;
                }
                else if (((_pic_parameter_set_id->slice_type == 3) ||
                         (_pic_parameter_set_id->slice_type == 4)) &&
                        (iVar2 = vs_se((bitstream *)seqparms_local,
                                       &_pic_parameter_set_id->slice_qs_delta), iVar2 != 0)) {
                  str_local._4_4_ = 1;
                }
                else {
                  if (_pic_parameter_set_id->picparm->deblocking_filter_control_present_flag == 0) {
                    iVar2 = vs_infer((bitstream *)seqparms_local,
                                     &_pic_parameter_set_id->disable_deblocking_filter_idc,0);
                    if (iVar2 != 0) {
                      return 1;
                    }
                    iVar2 = vs_infers((bitstream *)seqparms_local,
                                      &_pic_parameter_set_id->slice_alpha_c0_offset_div2,0);
                    if (iVar2 != 0) {
                      return 1;
                    }
                    iVar2 = vs_infers((bitstream *)seqparms_local,
                                      &_pic_parameter_set_id->slice_beta_offset_div2,0);
                    if (iVar2 != 0) {
                      return 1;
                    }
                  }
                  else {
                    iVar2 = vs_ue((bitstream *)seqparms_local,
                                  &_pic_parameter_set_id->disable_deblocking_filter_idc);
                    if (iVar2 != 0) {
                      return 1;
                    }
                    if (_pic_parameter_set_id->disable_deblocking_filter_idc == 1) {
                      iVar2 = vs_infers((bitstream *)seqparms_local,
                                        &_pic_parameter_set_id->slice_alpha_c0_offset_div2,0);
                      if (iVar2 != 0) {
                        return 1;
                      }
                      iVar2 = vs_infers((bitstream *)seqparms_local,
                                        &_pic_parameter_set_id->slice_beta_offset_div2,0);
                      if (iVar2 != 0) {
                        return 1;
                      }
                    }
                    else {
                      iVar2 = vs_se((bitstream *)seqparms_local,
                                    &_pic_parameter_set_id->slice_alpha_c0_offset_div2);
                      if (iVar2 != 0) {
                        return 1;
                      }
                      iVar2 = vs_se((bitstream *)seqparms_local,
                                    &_pic_parameter_set_id->slice_beta_offset_div2);
                      if (iVar2 != 0) {
                        return 1;
                      }
                    }
                  }
                  str_00 = seqparms_local;
                  if (((_pic_parameter_set_id->picparm->num_slice_groups_minus1 != 0) &&
                      (2 < _pic_parameter_set_id->picparm->slice_group_map_type)) &&
                     (_pic_parameter_set_id->picparm->slice_group_map_type < 6)) {
                    val = &_pic_parameter_set_id->slice_group_change_cycle;
                    iVar2 = clog2((ulong)(((_pic_parameter_set_id->seqparm->pic_width_in_mbs_minus1
                                           + 1) * (_pic_parameter_set_id->seqparm->
                                                   pic_height_in_map_units_minus1 + 1) +
                                          _pic_parameter_set_id->picparm->
                                          slice_group_change_rate_minus1) /
                                          (_pic_parameter_set_id->picparm->
                                           slice_group_change_rate_minus1 + 1) + 1));
                    iVar2 = vs_u((bitstream *)str_00,val,iVar2);
                    if (iVar2 != 0) {
                      return 1;
                    }
                  }
                  if ((_pic_parameter_set_id->picparm->num_slice_groups_minus1 == 0) ||
                     (iVar2 = h264_prep_sgmap(_pic_parameter_set_id), iVar2 == 0)) {
                    if (_pic_parameter_set_id->seqparm->is_svc == 0) {
                      str_local._4_4_ = 0;
                    }
                    else {
                      fprintf(_stderr,"SVC\n");
                      str_local._4_4_ = 1;
                    }
                  }
                  else {
                    str_local._4_4_ = 1;
                  }
                }
              }
              else {
                str_local._4_4_ = 1;
              }
            }
            else {
              str_local._4_4_ = 1;
            }
          }
          else {
            str_local._4_4_ = 1;
          }
        }
        else {
          str_local._4_4_ = 1;
        }
      }
      else {
        str_local._4_4_ = 1;
      }
    }
    else {
      str_local._4_4_ = 1;
    }
  }
  else {
    str_local._4_4_ = 1;
  }
  return str_local._4_4_;
}

Assistant:

int h264_slice_header(struct bitstream *str, struct h264_seqparm **seqparms, struct h264_picparm **picparms, struct h264_slice *slice) {
	if (vs_ue(str, &slice->first_mb_in_slice)) return 1;
	uint32_t slice_type = slice->slice_type + slice->slice_all_same * 5;
	if (vs_ue(str, &slice_type)) return 1;
	slice->slice_type = slice_type % 5;
	slice->slice_all_same = slice_type / 5;
	uint32_t pic_parameter_set_id;
	if (str->dir == VS_ENCODE)
		pic_parameter_set_id = slice->picparm->pic_parameter_set_id;
	if (vs_ue(str, &pic_parameter_set_id)) return 1;
	if (str->dir == VS_DECODE) {
		if (pic_parameter_set_id > 255) {
			fprintf(stderr, "pic_parameter_set_id out of range\n");
			return 1;
		}
		slice->picparm = picparms[pic_parameter_set_id];
		if (!slice->picparm) {
			fprintf(stderr, "pic_parameter_set_id doesn't specify a picparm\n");
			return 1;
		}
		slice->seqparm = seqparms[slice->picparm->seq_parameter_set_id];
		if (!slice->seqparm) {
			fprintf(stderr, "seq_parameter_set_id doesn't specify a seqparm\n");
			return 1;
		}
		if (slice->nal_unit_type == H264_NAL_UNIT_TYPE_SLICE_AUX) {
			slice->chroma_array_type = 0;
			slice->bit_depth_luma_minus8 = slice->seqparm->bit_depth_aux_minus8;
			slice->bit_depth_chroma_minus8 = 0;
		} else {
			slice->chroma_array_type = (slice->seqparm->separate_colour_plane_flag?0:slice->seqparm->chroma_format_idc);
			slice->bit_depth_luma_minus8 = slice->seqparm->bit_depth_luma_minus8;
			slice->bit_depth_chroma_minus8 = slice->seqparm->bit_depth_chroma_minus8;
		}
		slice->pic_width_in_mbs = slice->seqparm->pic_width_in_mbs_minus1 + 1;
	}
	if (slice->seqparm->separate_colour_plane_flag)
		if (vs_u(str, &slice->colour_plane_id, 2)) return 1;
	if (vs_u(str, &slice->frame_num, slice->seqparm->log2_max_frame_num_minus4 + 4)) return 1;
	if (!slice->seqparm->frame_mbs_only_flag) {
		if (vs_u(str, &slice->field_pic_flag, 1)) return 1;
	} else {
		if (vs_infer(str, &slice->field_pic_flag, 0)) return 1;
	}
	if (slice->field_pic_flag) {
		if (vs_u(str, &slice->bottom_field_flag, 1)) return 1;
	} else {
		if (vs_infer(str, &slice->bottom_field_flag, 0)) return 1;
	}
	slice->pic_height_in_mbs = (slice->seqparm->pic_height_in_map_units_minus1 + 1);
	if (!slice->seqparm->frame_mbs_only_flag)
		slice->pic_height_in_mbs *= 2;
	if (slice->field_pic_flag)
		slice->pic_height_in_mbs /= 2;
	slice->pic_size_in_mbs = slice->pic_width_in_mbs * slice->pic_height_in_mbs;
	if (str->dir == VS_DECODE) {
		slice->mbaff_frame_flag = slice->seqparm->mb_adaptive_frame_field_flag && !slice->field_pic_flag;
	}
	if (slice->idr_pic_flag) {
		if (vs_ue(str, &slice->idr_pic_id)) return 1;
	}
	switch (slice->seqparm->pic_order_cnt_type) {
		case 0:
			if (vs_u(str, &slice->pic_order_cnt_lsb, slice->seqparm->log2_max_pic_order_cnt_lsb_minus4 + 4)) return 1;
			if (slice->picparm->bottom_field_pic_order_in_frame_present_flag && !slice->field_pic_flag) {
				if (vs_se(str, &slice->delta_pic_order_cnt_bottom)) return 1;
			} else {
				if (vs_infers(str, &slice->delta_pic_order_cnt_bottom, 0)) return 1;
			}
			break;
		case 1:
			if (!slice->seqparm->delta_pic_order_always_zero_flag) {
				if (vs_se(str, &slice->delta_pic_order_cnt[0])) return 1;
				if (slice->picparm->bottom_field_pic_order_in_frame_present_flag && !slice->field_pic_flag) {
					if (vs_se(str, &slice->delta_pic_order_cnt[1])) return 1;
				} else {
					if (vs_infers(str, &slice->delta_pic_order_cnt[1], 0)) return 1;
				}
			} else {
				if (vs_infers(str, &slice->delta_pic_order_cnt[0], 0)) return 1;
				if (vs_infers(str, &slice->delta_pic_order_cnt[1], 0)) return 1;
			}
			break;
	}
	if (slice->picparm->redundant_pic_cnt_present_flag) {
		if (vs_ue(str, &slice->redundant_pic_cnt)) return 1;
	} else {
		if (vs_infer(str, &slice->redundant_pic_cnt, 0)) return 1;
	}
	if (!slice->seqparm->is_svc || slice->svc.quality_id == 0) {
		if (slice->slice_type == H264_SLICE_TYPE_B)
			if (vs_u(str, &slice->direct_spatial_mb_pred_flag, 1)) return 1;
		if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
			if (vs_u(str, &slice->num_ref_idx_active_override_flag, 1)) return 1;
			if (slice->num_ref_idx_active_override_flag) {
				if (vs_ue(str, &slice->num_ref_idx_l0_active_minus1)) return 1;
				if (slice->slice_type == H264_SLICE_TYPE_B)
					if (vs_ue(str, &slice->num_ref_idx_l1_active_minus1)) return 1;
			} else {
				if (vs_infer(str, &slice->num_ref_idx_l0_active_minus1, slice->picparm->num_ref_idx_l0_default_active_minus1)) return 1;
				if (slice->slice_type == H264_SLICE_TYPE_B)
					if (vs_infer(str, &slice->num_ref_idx_l1_active_minus1, slice->picparm->num_ref_idx_l1_default_active_minus1)) return 1;

			}
			if (slice->num_ref_idx_l0_active_minus1 > 31) {
				fprintf(stderr, "num_ref_idx_l0_active_minus1 out of range\n");
				return 1;
			}
			if (slice->num_ref_idx_l1_active_minus1 > 31) {
				fprintf(stderr, "num_ref_idx_l1_active_minus1 out of range\n");
				return 1;
			}
			/* ref_pic_list_modification */
			if (h264_ref_pic_list_modification(str, slice, &slice->ref_pic_list_modification_l0)) return 1;
			if (slice->slice_type == H264_SLICE_TYPE_B) {
				if (h264_ref_pic_list_modification(str, slice, &slice->ref_pic_list_modification_l1)) return 1;
			}
		}
		if ((slice->picparm->weighted_pred_flag && (slice->slice_type == H264_SLICE_TYPE_P || slice->slice_type == H264_SLICE_TYPE_SP)) || (slice->picparm->weighted_bipred_idc == 1 && slice->slice_type == H264_SLICE_TYPE_B)) {
			if (slice->seqparm->is_svc && !slice->svc.no_inter_layer_pred_flag) {
				if (vs_u(str, &slice->base_pred_weight_table_flag, 1)) return 1;
			} else {
				if (vs_infer(str, &slice->base_pred_weight_table_flag, 0)) return 1;
			}
			if (!slice->base_pred_weight_table_flag)
				if (h264_pred_weight_table(str, slice, &slice->pred_weight_table)) return 1;
		}
		if (slice->nal_ref_idc) {
			if (h264_dec_ref_pic_marking(str, slice->idr_pic_flag, &slice->dec_ref_pic_marking)) return 1;
			if (slice->seqparm->is_svc && !slice->seqparm->slice_header_restriction_flag) {
				if (h264_dec_ref_base_pic_marking(str, &slice->svc, &slice->dec_ref_base_pic_marking)) return 1;
			}
		}
	} else {
		/* XXX: infer me */
	}
	if (slice->picparm->entropy_coding_mode_flag && slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
		if (vs_ue(str, &slice->cabac_init_idc)) return 1;
		if (slice->cabac_init_idc > 2) {
			fprintf(stderr, "cabac_init_idc out of range!\n");
			return 1;
		}
	}
	if (vs_se(str, &slice->slice_qp_delta)) return 1;
	slice->sliceqpy = slice->picparm->pic_init_qp_minus26 + 26 + slice->slice_qp_delta;
	if (slice->slice_type == H264_SLICE_TYPE_SP)
		if (vs_u(str, &slice->sp_for_switch_flag, 1)) return 1;
	if (slice->slice_type == H264_SLICE_TYPE_SP || slice->slice_type == H264_SLICE_TYPE_SI)
		if (vs_se(str, &slice->slice_qs_delta)) return 1;
	if (slice->picparm->deblocking_filter_control_present_flag) {
		if (vs_ue(str, &slice->disable_deblocking_filter_idc)) return 1;
		if (slice->disable_deblocking_filter_idc != 1) {
			if (vs_se(str, &slice->slice_alpha_c0_offset_div2)) return 1;
			if (vs_se(str, &slice->slice_beta_offset_div2)) return 1;
		} else {
			if (vs_infers(str, &slice->slice_alpha_c0_offset_div2, 0)) return 1;
			if (vs_infers(str, &slice->slice_beta_offset_div2, 0)) return 1;
		}
	} else {
		if (vs_infer(str, &slice->disable_deblocking_filter_idc, 0)) return 1;
		if (vs_infers(str, &slice->slice_alpha_c0_offset_div2, 0)) return 1;
		if (vs_infers(str, &slice->slice_beta_offset_div2, 0)) return 1;
	}
	if (slice->picparm->num_slice_groups_minus1 && slice->picparm->slice_group_map_type >= 3 && slice->picparm->slice_group_map_type <= 5)
		if (vs_u(str, &slice->slice_group_change_cycle, clog2(((slice->seqparm->pic_width_in_mbs_minus1 + 1) * (slice->seqparm->pic_height_in_map_units_minus1 + 1) + slice->picparm->slice_group_change_rate_minus1) / (slice->picparm->slice_group_change_rate_minus1 + 1) + 1))) return 1;
	if (slice->picparm->num_slice_groups_minus1)
		if (h264_prep_sgmap(slice)) return 1;
	if (slice->seqparm->is_svc) {
		/* XXX */
		fprintf(stderr, "SVC\n");
		return 1;
	}
	return 0;
}